

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O2

void Abc_NtkRestrashRandom_rec(Abc_Ntk_t *pNtk,Abc_Obj_t *pObj)

{
  int iVar1;
  void **ppvVar2;
  Abc_Aig_t *pMan;
  int iVar3;
  uint uVar4;
  int *piVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *p1;
  int in_EDX;
  int Fill;
  Vec_Int_t *pVVar7;
  
  pVVar7 = &pObj->pNtk->vTravIds;
  iVar1 = pObj->Id;
  Vec_IntFillExtra(pVVar7,iVar1 + 1,in_EDX);
  iVar3 = Vec_IntEntry(pVVar7,iVar1);
  iVar1 = pObj->pNtk->nTravIds;
  if (iVar3 != iVar1) {
    pVVar7 = &pObj->pNtk->vTravIds;
    iVar3 = pObj->Id;
    Vec_IntFillExtra(pVVar7,iVar3 + 1,Fill);
    Vec_IntWriteEntry(pVVar7,iVar3,iVar1);
    if ((*(uint *)&pObj->field_0x14 & 0xf) == 7) {
      uVar4 = rand();
      piVar5 = (pObj->vFanins).pArray;
      ppvVar2 = pObj->pNtk->vObjs->pArray;
      if ((uVar4 & 1) == 0) {
        Abc_NtkRestrashRandom_rec(pNtk,(Abc_Obj_t *)ppvVar2[piVar5[1]]);
        piVar5 = (pObj->vFanins).pArray;
      }
      else {
        Abc_NtkRestrashRandom_rec(pNtk,(Abc_Obj_t *)ppvVar2[*piVar5]);
        piVar5 = (pObj->vFanins).pArray + 1;
      }
      Abc_NtkRestrashRandom_rec(pNtk,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*piVar5]);
      pMan = (Abc_Aig_t *)pNtk->pManFunc;
      pAVar6 = Abc_ObjChild0Copy(pObj);
      p1 = Abc_ObjChild1Copy(pObj);
      pAVar6 = Abc_AigAnd(pMan,pAVar6,p1);
      (pObj->field_6).pCopy = pAVar6;
    }
  }
  return;
}

Assistant:

void Abc_NtkRestrashRandom_rec( Abc_Ntk_t * pNtk, Abc_Obj_t * pObj )
{
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( !Abc_ObjIsNode(pObj) )
        return;
    if ( rand() & 1 )
    {
        Abc_NtkRestrashRandom_rec( pNtk, Abc_ObjFanin0(pObj) );
        Abc_NtkRestrashRandom_rec( pNtk, Abc_ObjFanin1(pObj) );
    }
    else
    {
        Abc_NtkRestrashRandom_rec( pNtk, Abc_ObjFanin1(pObj) );
        Abc_NtkRestrashRandom_rec( pNtk, Abc_ObjFanin0(pObj) );
    }
    pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
}